

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  char *pcVar4;
  ostream *poVar5;
  size_t __nbytes;
  void *__buf;
  void *__buf_00;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  double local_110;
  double duration;
  int i;
  int numinputs;
  double sum;
  undefined1 local_f0 [4];
  int counter;
  MidiFile midifile;
  string local_78 [32];
  uint local_58;
  int minuteQ;
  allocator local_41;
  string local_40 [36];
  uint local_1c;
  char **ppcStack_18;
  int fileQ;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  checkOptions(&options,argc,argv);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"filename",&local_41);
  bVar1 = smf::Options::getBoolean(&options,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_1c = (uint)bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"minute",(allocator *)&midifile.field_0x6f);
  bVar1 = smf::Options::getBoolean(&options,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&midifile.field_0x6f);
  local_58 = (uint)bVar1;
  smf::MidiFile::MidiFile((MidiFile *)local_f0);
  sum._4_4_ = 0;
  _i = 0.0;
  duration._4_4_ = smf::Options::getArgCount(&options);
  for (duration._0_4_ = 0; __nbytes = (size_t)duration._0_4_,
      (int)duration._0_4_ < duration._4_4_ || duration._0_4_ == 0;
      duration._0_4_ = duration._0_4_ + 1) {
    smf::MidiFile::clear((MidiFile *)local_f0);
    iVar2 = smf::Options::getArgCount(&options);
    if (iVar2 < 1) {
      smf::MidiFile::read((MidiFile *)local_f0,0x161338,__buf,__nbytes);
    }
    else {
      psVar3 = smf::Options::getArg_abi_cxx11_(&options,duration._0_4_ + 1);
      smf::MidiFile::read((MidiFile *)local_f0,(int)psVar3,__buf_00,__nbytes);
    }
    iVar2 = smf::Options::getArgCount(&options);
    if (1 < iVar2) {
      psVar3 = smf::Options::getArg_abi_cxx11_(&options,duration._0_4_ + 1);
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)psVar3);
      std::operator<<(poVar5,"\t");
    }
    local_110 = getTotalDuration((MidiFile *)local_f0);
    _i = _i + local_110;
    sum._4_4_ = sum._4_4_ + 1;
    std::ostream::operator<<(&std::cout,local_110);
    if (local_58 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\t");
      minutes_abi_cxx11_(local_110);
      std::operator<<(poVar5,local_130);
      std::__cxx11::string::~string(local_130);
    }
    if (local_1c != 0) {
      std::operator<<((ostream *)&std::cout,"\t");
      pcVar4 = smf::MidiFile::getFilename((MidiFile *)local_f0);
      std::operator<<((ostream *)&std::cout,pcVar4);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  if (1 < sum._4_4_) {
    poVar5 = std::operator<<((ostream *)&std::cout,"TOTAL\t");
    std::ostream::operator<<(poVar5,_i);
    if (local_58 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\t");
      minutes_abi_cxx11_(_i);
      std::operator<<(poVar5,local_150);
      std::__cxx11::string::~string(local_150);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"AVERAGE\t");
    std::ostream::operator<<(poVar5,_i / (double)sum._4_4_);
    if (local_58 != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"\t");
      minutes_abi_cxx11_(_i / (double)sum._4_4_);
      std::operator<<(poVar5,local_170);
      std::__cxx11::string::~string(local_170);
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  smf::MidiFile::~MidiFile((MidiFile *)local_f0);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
   checkOptions(options, argc, argv);
	int fileQ  = options.getBoolean("filename");
	int minuteQ = options.getBoolean("minute");

   MidiFile midifile;

	int counter = 0;
	double sum = 0.0;
   int numinputs = options.getArgCount();
   for (int i=0; i < numinputs || i==0; i++) {
      midifile.clear();
      if (options.getArgCount() < 1) {
         midifile.read(cin);
      } else {
         midifile.read(options.getArg(i+1));
      }
      if (options.getArgCount() > 1) {
         cout << options.getArg(i+1) << "\t";
      }
		double duration = getTotalDuration(midifile);
		sum += duration;
		counter++;
      cout << duration;
		if (minuteQ) {
			cout << "\t" << minutes(duration);
		}
		if (fileQ) {
			cout << "\t";
			cout << midifile.getFilename();
		}
      cout << endl;
   }
	if (counter > 1) {
		cout << "TOTAL\t" << sum;
		if (minuteQ) {
			cout << "\t" << minutes(sum);
		}
		cout << endl;
		cout << "AVERAGE\t" << sum/counter;
		if (minuteQ) {
			cout << "\t" << minutes(sum/counter);
		}
		cout << endl;
	}
}